

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

void __thiscall
BMRS_XZ<UFPC>::FindRuns
          (BMRS_XZ<UFPC> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint j;
  long lVar3;
  long lVar4;
  uint *puVar5;
  ushort uVar6;
  uint i;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  Run *pRVar11;
  Run *pRVar12;
  long lVar13;
  short sVar14;
  ushort uVar15;
  unsigned_short uVar16;
  uint64_t *puVar17;
  uint uVar18;
  Run *pRVar19;
  uint64_t *puVar20;
  uint64_t *puVar21;
  uint64_t *puVar22;
  ulong uVar23;
  uint64_t uVar24;
  
  puVar5 = UFPC::P_;
  lVar8 = (long)data_width;
  uVar24 = *bits_start;
  sVar14 = 0;
  pRVar11 = runs;
  puVar17 = bits_start;
  while( true ) {
    while (puVar21 = puVar17 + 1, uVar24 != 0) {
      lVar13 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      pRVar11->start_pos = (short)lVar13 + sVar14;
      uVar23 = (~uVar24 >> ((byte)lVar13 & 0x3f)) << ((byte)lVar13 & 0x3f);
      while (uVar23 == 0) {
        sVar14 = sVar14 + 0x40;
        puVar1 = puVar17 + 1;
        puVar17 = puVar17 + 1;
        uVar23 = ~*puVar1;
      }
      lVar13 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      pRVar11->end_pos = (short)lVar13 + sVar14;
      puVar5[UFPC::length_] = UFPC::length_;
      uVar9 = UFPC::length_ + 1;
      pRVar11->label = UFPC::length_;
      UFPC::length_ = uVar9;
      pRVar11 = pRVar11 + 1;
      uVar24 = (~uVar23 >> ((byte)lVar13 & 0x3f)) << ((byte)lVar13 & 0x3f);
    }
    if (puVar21 == bits_start + lVar8) break;
    sVar14 = sVar14 + 0x40;
    uVar24 = *puVar21;
    puVar17 = puVar21;
  }
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar13 = 1;
LAB_0020aeea:
  if (height <= lVar13) {
    uVar9 = UFPC::Flatten();
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
    return;
  }
  pRVar12 = pRVar11 + 1;
  puVar17 = bits_flag + (lVar13 + -1) * lVar8;
  puVar21 = bits_start + lVar13 * lVar8;
  puVar22 = puVar21 + lVar8;
  uVar24 = *puVar21;
  lVar7 = 0;
  pRVar11 = pRVar12;
  do {
    while (puVar20 = puVar21 + 1, uVar24 != 0) {
      lVar3 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      uVar23 = (~uVar24 >> ((byte)lVar3 & 0x3f)) << ((byte)lVar3 & 0x3f);
      lVar10 = lVar7;
      while (uVar23 == 0) {
        lVar10 = lVar10 + 0x40;
        puVar1 = puVar21 + 1;
        puVar21 = puVar21 + 1;
        uVar23 = ~*puVar1;
      }
      lVar4 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      uVar9 = (int)lVar3 + (int)lVar7 & 0xffff;
      runs = runs + -1;
      do {
        pRVar19 = runs;
        uVar2 = pRVar19[1].end_pos;
        runs = pRVar19 + 1;
      } while (uVar2 < uVar9);
      uVar15 = (short)lVar3 + (short)lVar7;
      uVar6 = runs->start_pos;
      uVar16 = (unsigned_short)(lVar4 + lVar10);
      uVar18 = (uint)(lVar4 + lVar10) & 0xffff;
      if (uVar18 < uVar6) {
        pRVar11->start_pos = uVar15;
        pRVar11->end_pos = uVar16;
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        pRVar11->label = UFPC::length_;
        UFPC::length_ = uVar9;
      }
      else {
        if (uVar6 <= uVar9) {
          uVar6 = uVar15;
        }
        if (uVar2 < uVar18) {
          uVar24 = is_connected(this,puVar17,(uint)uVar6,(uint)uVar2);
          if (uVar24 == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = UFPC::P_[pRVar19[1].label];
          }
          while( true ) {
            i = uVar9;
            pRVar19 = runs;
            runs = pRVar19 + 1;
            uVar2 = runs->start_pos;
            uVar9 = i;
            if (uVar18 < uVar2) break;
            if (uVar18 <= pRVar19[1].end_pos) {
              uVar24 = is_connected(this,puVar17,(uint)uVar2,uVar18);
              if (((uVar24 != 0) && (uVar18 = UFPC::P_[pRVar19[1].label], i != uVar18)) &&
                 (uVar9 = uVar18, i != 0)) {
                uVar9 = UFPC::Merge(i,uVar18);
              }
              break;
            }
            uVar24 = is_connected(this,puVar17,(uint)uVar2,(uint)pRVar19[1].end_pos);
            if (((uVar24 != 0) && (j = UFPC::P_[pRVar19[1].label], i != j)) && (uVar9 = j, i != 0))
            {
              uVar9 = UFPC::Merge(i,j);
            }
          }
          if (uVar9 == 0) {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          pRVar11->label = uVar9;
          pRVar11->start_pos = uVar15;
          pRVar11->end_pos = uVar16;
        }
        else {
          uVar24 = is_connected(this,puVar17,(uint)uVar6,uVar18);
          if (uVar24 == 0) {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            uVar9 = UFPC::P_[pRVar19[1].label];
          }
          pRVar11->label = uVar9;
          pRVar11->start_pos = uVar15;
          pRVar11->end_pos = uVar16;
        }
      }
      pRVar11 = pRVar11 + 1;
      lVar7 = lVar10;
      uVar24 = -1L << ((byte)lVar4 & 0x3f) & ~uVar23;
    }
    if (puVar20 == puVar22) break;
    uVar24 = *puVar20;
    lVar7 = lVar7 + 0x40;
    puVar21 = puVar20;
  } while( true );
  pRVar11->start_pos = 0xffff;
  pRVar11->end_pos = 0xffff;
  lVar13 = lVar13 + 1;
  runs = pRVar12;
  goto LAB_0020aeea;
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }